

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtc.c
# Opt level: O2

void read_register(rtc_t *rtc)

{
  byte bVar1;
  tm *ptVar2;
  char *__format;
  time_t rawtime;
  
  switch(rtc->reg) {
  case '\0':
    puts("RESET");
    rtc->buffer = 0;
    (rtc->control_reg).raw = '\0';
    return;
  default:
    fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
            "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/mem/gpio/rtc.c",
            0x58);
    fprintf(_stderr,"Reading unknown register: 0x%X\n\x1b[0;m",(ulong)rtc->reg);
    exit(1);
  case '\x02':
    time(&rawtime);
    ptVar2 = localtime(&rawtime);
    bVar1 = to_bcd((uint8_t)ptVar2->tm_sec);
    rtc->buffer = (ulong)bVar1 << 8;
    bVar1 = to_bcd((uint8_t)ptVar2->tm_min);
    rtc->buffer = ((ulong)bVar1 | rtc->buffer) << 8;
    bVar1 = to_bcd((uint8_t)ptVar2->tm_hour);
    rtc->buffer = ((ulong)bVar1 | rtc->buffer) << 8;
    bVar1 = to_bcd((uint8_t)ptVar2->tm_wday);
    rtc->buffer = ((ulong)bVar1 | rtc->buffer) << 8;
    bVar1 = to_bcd((uint8_t)ptVar2->tm_mday);
    rtc->buffer = ((ulong)bVar1 | rtc->buffer) << 8;
    bVar1 = to_bcd((char)ptVar2->tm_mon + '\x01');
    rtc->buffer = ((ulong)bVar1 | rtc->buffer) << 8;
    bVar1 = to_bcd((char)ptVar2->tm_year + 0x9c);
    rtc->buffer = (ulong)bVar1 | rtc->buffer;
    __format = "DATETIME_REG: 0x%012lX\n";
    break;
  case '\x04':
    rtc->buffer = (ulong)(rtc->control_reg).raw;
    (rtc->control_reg).raw = (rtc->control_reg).raw & 0x7f;
    printf("CONTROL_REG: 0x%02lX\n");
    return;
  case '\x06':
    time(&rawtime);
    ptVar2 = localtime(&rawtime);
    bVar1 = to_bcd((uint8_t)ptVar2->tm_sec);
    rtc->buffer = (ulong)bVar1 << 8;
    bVar1 = to_bcd((uint8_t)ptVar2->tm_min);
    rtc->buffer = ((ulong)bVar1 | rtc->buffer) << 8;
    bVar1 = to_bcd((uint8_t)ptVar2->tm_hour);
    rtc->buffer = (ulong)bVar1 | rtc->buffer;
    __format = "TIME_REG: 0x%lX\n";
  }
  printf(__format);
  return;
}

Assistant:

void read_register(rtc_t* rtc) {
    switch (rtc->reg) {
        case RESET_REG:
            printf("RESET\n");
            rtc->buffer = 0;
            rtc->control_reg.raw = 0;
            break;
        case DATETIME_REG: {
            time_t rawtime;
            struct tm *timeinfo;
            time(&rawtime);
            timeinfo = localtime(&rawtime);

            rtc->buffer = to_bcd(timeinfo->tm_sec);
            rtc->buffer <<= 8;

            rtc->buffer |= to_bcd(timeinfo->tm_min);
            rtc->buffer <<= 8;

            rtc->buffer |= to_bcd(timeinfo->tm_hour);
            rtc->buffer <<= 8;

            rtc->buffer |= to_bcd(timeinfo->tm_wday);
            rtc->buffer <<= 8;

            rtc->buffer |= to_bcd(timeinfo->tm_mday);
            rtc->buffer <<= 8;

            rtc->buffer |= to_bcd(timeinfo->tm_mon + 1);
            rtc->buffer <<= 8;

            rtc->buffer |= to_bcd(timeinfo->tm_year - 100);
            printf("DATETIME_REG: 0x%012lX\n", rtc->buffer);
            break;
        }
        case CONTROL_REG:
            rtc->buffer = rtc->control_reg.raw;
            rtc->control_reg.poweroff = 0;
            printf("CONTROL_REG: 0x%02lX\n", rtc->buffer);
            break;
        case TIME_REG: {
            time_t rawtime;
            struct tm *timeinfo;
            time(&rawtime);
            timeinfo = localtime(&rawtime);

            rtc->buffer = to_bcd(timeinfo->tm_sec);
            rtc->buffer <<= 8;

            rtc->buffer |= to_bcd(timeinfo->tm_min);
            rtc->buffer <<= 8;

            rtc->buffer |= to_bcd(timeinfo->tm_hour);

            printf("TIME_REG: 0x%lX\n", rtc->buffer);
            break;
        }
        default:
            logfatal("Reading unknown register: 0x%X", rtc->reg)
    }

}